

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

int TVMCFuncSetReturn(TVMRetValueHandle ret,TVMValue *value,int *type_code,int num_ret)

{
  ostream *poVar1;
  LogCheckError _check_err;
  TVMValue local_1a0;
  int local_198;
  
  dmlc::LogCheck_EQ(_check_err.str._4_4_,(int)_check_err.str);
  if (CONCAT44(_check_err.str._4_4_,(int)_check_err.str) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0.v_type,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc"
               ,0x1f0);
    poVar1 = std::operator<<((ostream *)&local_1a0.v_type,"Check failed: ");
    poVar1 = std::operator<<(poVar1,"num_ret == 1");
    poVar1 = std::operator<<(poVar1,(string *)CONCAT44(_check_err.str._4_4_,(int)_check_err.str));
    std::operator<<(poVar1,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0.v_type);
  }
  dmlc::LogCheckError::~LogCheckError(&_check_err);
  local_1a0 = *value;
  local_198 = *type_code;
  tvm::runtime::TVMRetValue::Assign<tvm::runtime::TVMArgValue>
            ((TVMRetValue *)ret,(TVMArgValue *)&local_1a0.v_type);
  return 0;
}

Assistant:

int TVMCFuncSetReturn(TVMRetValueHandle ret,
                      TVMValue* value,
                      int* type_code,
                      int num_ret) {
  API_BEGIN();
  CHECK_EQ(num_ret, 1);
  TVMRetValue* rv = static_cast<TVMRetValue*>(ret);
  *rv = TVMArgValue(value[0], type_code[0]);
  API_END();
}